

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O0

void Cmd_changesky(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  FTextureID local_2c;
  char *pcStack_28;
  FTextureID newsky;
  char *sky1name;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if ((!netgame) && (iVar2 = FCommandLine::argc(argv), 1 < iVar2)) {
    pcStack_28 = FCommandLine::operator[](argv,1);
    if (*pcStack_28 != '\0') {
      local_2c = FTextureManager::GetTexture(&TexMan,pcStack_28,1,6);
      bVar1 = FTextureID::Exists(&local_2c);
      if (bVar1) {
        level.skytexture1.texnum = local_2c.texnum;
        sky1texture.texnum = local_2c.texnum;
      }
      else {
        Printf("changesky: Texture \'%s\' not found\n",pcStack_28);
      }
    }
    R_InitSkyMap();
  }
  return;
}

Assistant:

CCMD(changesky)
{
	const char *sky1name;

	if (netgame || argv.argc()<2) return;

	sky1name = argv[1];
	if (sky1name[0] != 0)
	{
		FTextureID newsky = TexMan.GetTexture(sky1name, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable | FTextureManager::TEXMAN_ReturnFirst);
		if (newsky.Exists())
		{
			sky1texture = level.skytexture1 = newsky;
		}
		else
		{
			Printf("changesky: Texture '%s' not found\n", sky1name);
		}
	}
	R_InitSkyMap ();
}